

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetector.cpp
# Opt level: O0

MemoryLeakDetectorNode * __thiscall
MemoryLeakDetectorList::removeNode(MemoryLeakDetectorList *this,char *memory)

{
  MemoryLeakDetectorNode *local_30;
  MemoryLeakDetectorNode *prev;
  MemoryLeakDetectorNode *cur;
  char *memory_local;
  MemoryLeakDetectorList *this_local;
  
  prev = this->head_;
  local_30 = (MemoryLeakDetectorNode *)0x0;
  while( true ) {
    if (prev == (MemoryLeakDetectorNode *)0x0) {
      return (MemoryLeakDetectorNode *)0x0;
    }
    if (*(char **)(prev + 0x10) == memory) break;
    local_30 = prev;
    prev = *(MemoryLeakDetectorNode **)(prev + 0x38);
  }
  if (local_30 != (MemoryLeakDetectorNode *)0x0) {
    *(undefined8 *)(local_30 + 0x38) = *(undefined8 *)(prev + 0x38);
    return prev;
  }
  this->head_ = *(MemoryLeakDetectorNode **)(prev + 0x38);
  return prev;
}

Assistant:

MemoryLeakDetectorNode* MemoryLeakDetectorList::removeNode(char* memory)
{
    MemoryLeakDetectorNode* cur = head_;
    MemoryLeakDetectorNode* prev = NULLPTR;
    while (cur) {
        if (cur->memory_ == memory) {
            if (prev) {
                prev->next_ = cur->next_;
                return cur;
            }
            else {
                head_ = cur->next_;
                return cur;
            }
        }
        prev = cur;
        cur = cur->next_;
    }
    return NULLPTR;
}